

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
cmListCommand::HandleSortCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  cmStringSorter __comp;
  pointer name;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  iterator iVar6;
  iterator __last;
  char *value_00;
  undefined1 local_628 [8];
  string value;
  undefined1 auStack_5e0 [8];
  cmStringSorter sorter;
  undefined1 local_5b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string *listName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  undefined1 local_558 [8];
  string error_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f8 [8];
  string error_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined1 local_458 [8];
  string error_7;
  string argument_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined1 local_3d8 [8];
  string error_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  string error_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [8];
  string error_4;
  string argument_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  string error_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string error_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string error_1;
  string argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string error;
  string option;
  undefined1 local_88 [8];
  string messageHint;
  size_t argumentIndex;
  Order sortOrder;
  CaseSensitivity sortCaseSensitivity;
  Compare sortCompare;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmListCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 2) {
    __assert_fail("args.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx"
                  ,0x495,"bool cmListCommand::HandleSortCommand(const std::vector<std::string> &)");
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (sVar4 < 9) {
    sortOrder = UNINITIALIZED;
    argumentIndex._4_4_ = UNINITIALIZED;
    argumentIndex._0_4_ = UNINITIALIZED;
    messageHint.field_2._8_8_ = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"sub-command SORT ",
               (allocator<char> *)(option.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(option.field_2._M_local_buf + 0xf));
    do {
      uVar1 = messageHint.field_2._8_8_;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      uVar2 = messageHint.field_2._8_8_;
      if (sVar4 <= (ulong)uVar1) {
        if (sortOrder == UNINITIALIZED) {
          sortOrder = ASCENDING;
        }
        if (argumentIndex._4_4_ == UNINITIALIZED) {
          argumentIndex._4_4_ = SENSITIVE;
        }
        if ((Order)argumentIndex == UNINITIALIZED) {
          argumentIndex._0_4_ = ASCENDING;
        }
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5b8);
        bVar3 = GetList(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_5b8,
                        varArgsExpanded.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar3) {
          if (((sortOrder == ASCENDING) && (argumentIndex._4_4_ == SENSITIVE)) &&
             ((Order)argumentIndex == ASCENDING)) {
            iVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5b8);
            sorter._16_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_5b8);
            std::
            sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar6._M_current,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )sorter._16_8_);
          }
          else {
            cmStringSorter::cmStringSorter
                      ((cmStringSorter *)auStack_5e0,sortOrder,argumentIndex._4_4_,
                       (Order)argumentIndex);
            iVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5b8);
            __last = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_5b8);
            value.field_2._8_8_ = auStack_5e0;
            __comp.filters[1] = sorter.filters[0];
            __comp.filters[0] = (StringFilter)auStack_5e0;
            __comp._16_8_ = sorter.filters[1];
            std::
            sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmStringSorter>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar6._M_current,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__last._M_current,__comp);
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_628,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5b8,";");
          name = varArgsExpanded.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
          this_00 = (this->super_cmCommand).Makefile;
          value_00 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(this_00,name,value_00);
          this_local._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_628);
        }
        else {
          this_local._7_1_ = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5b8);
        break;
      }
      messageHint.field_2._8_8_ = messageHint.field_2._8_8_ + 1;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,uVar2);
      std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8),(string *)pvVar5);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&error.field_2 + 8),"COMPARE");
      uVar1 = messageHint.field_2._8_8_;
      if (bVar3) {
        if (sortOrder == UNINITIALIZED) {
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_20);
          uVar2 = messageHint.field_2._8_8_;
          if ((ulong)uVar1 < sVar4) {
            messageHint.field_2._8_8_ = messageHint.field_2._8_8_ + 1;
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,uVar2);
            std::__cxx11::string::string
                      ((string *)(error_1.field_2._M_local_buf + 8),(string *)pvVar5);
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&error_1.field_2 + 8),"STRING");
            if (bVar3) {
              sortOrder = ASCENDING;
LAB_00438d97:
              bVar3 = false;
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&error_1.field_2 + 8),"FILE_BASENAME");
              if (bVar3) {
                sortOrder = DESCENDING;
                goto LAB_00438d97;
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error_2.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88,"value \"");
              std::operator+(&local_1b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error_2.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error_1.field_2 + 8));
              std::operator+(&local_198,&local_1b8,"\" for option \"");
              std::operator+(&local_178,&local_198,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error.field_2 + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_158,&local_178,"\" is invalid.");
              std::__cxx11::string::~string((string *)&local_178);
              std::__cxx11::string::~string((string *)&local_198);
              std::__cxx11::string::~string((string *)&local_1b8);
              std::__cxx11::string::~string((string *)(error_2.field_2._M_local_buf + 8));
              cmCommand::SetError(&this->super_cmCommand,(string *)local_158);
              this_local._7_1_ = 0;
              bVar3 = true;
              std::__cxx11::string::~string((string *)local_158);
            }
            std::__cxx11::string::~string((string *)(error_1.field_2._M_local_buf + 8));
joined_r0x00438db5:
            if (!bVar3) {
LAB_004398d1:
              bVar3 = false;
            }
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&error_3.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"missing argument for option \"");
            std::operator+(&local_218,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&error_3.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&error.field_2 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1f8,&local_218,"\".");
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)(error_3.field_2._M_local_buf + 8));
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1f8);
            this_local._7_1_ = 0;
            bVar3 = true;
            std::__cxx11::string::~string((string *)local_1f8);
          }
        }
        else {
          std::operator+(&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,"option \"");
          std::operator+(&local_f0,&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&error.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0,&local_f0,"\" has been specified multiple times.");
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_d0);
          this_local._7_1_ = 0;
          bVar3 = true;
          std::__cxx11::string::~string((string *)local_d0);
        }
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&error.field_2 + 8),"CASE");
        uVar1 = messageHint.field_2._8_8_;
        if (bVar3) {
          if (argumentIndex._4_4_ == UNINITIALIZED) {
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(local_20);
            uVar2 = messageHint.field_2._8_8_;
            if ((ulong)uVar1 < sVar4) {
              messageHint.field_2._8_8_ = messageHint.field_2._8_8_ + 1;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,uVar2);
              std::__cxx11::string::string
                        ((string *)(error_4.field_2._M_local_buf + 8),(string *)pvVar5);
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&error_4.field_2 + 8),"SENSITIVE");
              if (bVar3) {
                argumentIndex._4_4_ = SENSITIVE;
LAB_00439225:
                bVar3 = false;
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&error_4.field_2 + 8),"INSENSITIVE");
                if (bVar3) {
                  argumentIndex._4_4_ = INSENSITIVE;
                  goto LAB_00439225;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&error_5.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_88,"value \"");
                std::operator+(&local_338,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&error_5.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&error_4.field_2 + 8));
                std::operator+(&local_318,&local_338,"\" for option \"");
                std::operator+(&local_2f8,&local_318,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&error.field_2 + 8));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2d8,&local_2f8,"\" is invalid.");
                std::__cxx11::string::~string((string *)&local_2f8);
                std::__cxx11::string::~string((string *)&local_318);
                std::__cxx11::string::~string((string *)&local_338);
                std::__cxx11::string::~string((string *)(error_5.field_2._M_local_buf + 8));
                cmCommand::SetError(&this->super_cmCommand,(string *)local_2d8);
                this_local._7_1_ = 0;
                bVar3 = true;
                std::__cxx11::string::~string((string *)local_2d8);
              }
              std::__cxx11::string::~string((string *)(error_4.field_2._M_local_buf + 8));
              goto joined_r0x00438db5;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&error_6.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"missing argument for option \"");
            std::operator+(&local_398,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&error_6.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&error.field_2 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_378,&local_398,"\".");
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)(error_6.field_2._M_local_buf + 8));
            cmCommand::SetError(&this->super_cmCommand,(string *)local_378);
            this_local._7_1_ = 0;
            bVar3 = true;
            std::__cxx11::string::~string((string *)local_378);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&argument_1.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"option \"");
            std::operator+(&local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&argument_1.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&error.field_2 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258,&local_278,"\" has been specified multiple times.");
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)(argument_1.field_2._M_local_buf + 8));
            cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
            this_local._7_1_ = 0;
            bVar3 = true;
            std::__cxx11::string::~string((string *)local_258);
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&error.field_2 + 8),"ORDER");
          uVar1 = messageHint.field_2._8_8_;
          if (bVar3) {
            if ((Order)argumentIndex == UNINITIALIZED) {
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(local_20);
              uVar2 = messageHint.field_2._8_8_;
              if ((ulong)uVar1 < sVar4) {
                messageHint.field_2._8_8_ = messageHint.field_2._8_8_ + 1;
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](local_20,uVar2);
                std::__cxx11::string::string
                          ((string *)(error_7.field_2._M_local_buf + 8),(string *)pvVar5);
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&error_7.field_2 + 8),"ASCENDING");
                if (bVar3) {
                  argumentIndex._0_4_ = ASCENDING;
LAB_004396b3:
                  bVar3 = false;
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&error_7.field_2 + 8),"DESCENDING");
                  if (bVar3) {
                    argumentIndex._0_4_ = DESCENDING;
                    goto LAB_004396b3;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&error_8.field_2 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_88,"value \"");
                  std::operator+(&local_4b8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&error_8.field_2 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&error_7.field_2 + 8));
                  std::operator+(&local_498,&local_4b8,"\" for option \"");
                  std::operator+(&local_478,&local_498,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&error.field_2 + 8));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_458,&local_478,"\" is invalid.");
                  std::__cxx11::string::~string((string *)&local_478);
                  std::__cxx11::string::~string((string *)&local_498);
                  std::__cxx11::string::~string((string *)&local_4b8);
                  std::__cxx11::string::~string((string *)(error_8.field_2._M_local_buf + 8));
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_458);
                  this_local._7_1_ = 0;
                  bVar3 = true;
                  std::__cxx11::string::~string((string *)local_458);
                }
                std::__cxx11::string::~string((string *)(error_7.field_2._M_local_buf + 8));
                if (bVar3) goto LAB_004398db;
                goto LAB_004398d1;
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error_9.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88,"missing argument for option \"");
              std::operator+(&local_518,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error_9.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error.field_2 + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4f8,&local_518,"\".");
              std::__cxx11::string::~string((string *)&local_518);
              std::__cxx11::string::~string((string *)(error_9.field_2._M_local_buf + 8));
              cmCommand::SetError(&this->super_cmCommand,(string *)local_4f8);
              this_local._7_1_ = 0;
              bVar3 = true;
              std::__cxx11::string::~string((string *)local_4f8);
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&argument_2.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88,"option \"");
              std::operator+(&local_3f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&argument_2.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error.field_2 + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3d8,&local_3f8,"\" has been specified multiple times.");
              std::__cxx11::string::~string((string *)&local_3f8);
              std::__cxx11::string::~string((string *)(argument_2.field_2._M_local_buf + 8));
              cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
              this_local._7_1_ = 0;
              bVar3 = true;
              std::__cxx11::string::~string((string *)local_3d8);
            }
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &listName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"option \"");
            std::operator+(&local_578,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &listName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&error.field_2 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_558,&local_578,"\" is unknown.");
            std::__cxx11::string::~string((string *)&local_578);
            std::__cxx11::string::~string((string *)&listName);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_558);
            this_local._7_1_ = 0;
            bVar3 = true;
            std::__cxx11::string::~string((string *)local_558);
          }
        }
      }
LAB_004398db:
      std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
    } while (!bVar3);
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command SORT only takes up to six arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListCommand::HandleSortCommand(std::vector<std::string> const& args)
{
  assert(args.size() >= 2);
  if (args.size() > 8) {
    this->SetError("sub-command SORT only takes up to six arguments.");
    return false;
  }

  auto sortCompare = cmStringSorter::Compare::UNINITIALIZED;
  auto sortCaseSensitivity = cmStringSorter::CaseSensitivity::UNINITIALIZED;
  auto sortOrder = cmStringSorter::Order::UNINITIALIZED;

  size_t argumentIndex = 2;
  const std::string messageHint = "sub-command SORT ";

  while (argumentIndex < args.size()) {
    const std::string option = args[argumentIndex++];
    if (option == "COMPARE") {
      if (sortCompare != cmStringSorter::Compare::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "STRING") {
          sortCompare = cmStringSorter::Compare::STRING;
        } else if (argument == "FILE_BASENAME") {
          sortCompare = cmStringSorter::Compare::FILE_BASENAME;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else if (option == "CASE") {
      if (sortCaseSensitivity !=
          cmStringSorter::CaseSensitivity::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "SENSITIVE") {
          sortCaseSensitivity = cmStringSorter::CaseSensitivity::SENSITIVE;
        } else if (argument == "INSENSITIVE") {
          sortCaseSensitivity = cmStringSorter::CaseSensitivity::INSENSITIVE;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else if (option == "ORDER") {

      if (sortOrder != cmStringSorter::Order::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "ASCENDING") {
          sortOrder = cmStringSorter::Order::ASCENDING;
        } else if (argument == "DESCENDING") {
          sortOrder = cmStringSorter::Order::DESCENDING;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else {
      std::string error =
        messageHint + "option \"" + option + "\" is unknown.";
      this->SetError(error);
      return false;
    }
  }
  // set Default Values if Option is not given
  if (sortCompare == cmStringSorter::Compare::UNINITIALIZED) {
    sortCompare = cmStringSorter::Compare::STRING;
  }
  if (sortCaseSensitivity == cmStringSorter::CaseSensitivity::UNINITIALIZED) {
    sortCaseSensitivity = cmStringSorter::CaseSensitivity::SENSITIVE;
  }
  if (sortOrder == cmStringSorter::Order::UNINITIALIZED) {
    sortOrder = cmStringSorter::Order::ASCENDING;
  }

  const std::string& listName = args[1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, listName)) {
    return true;
  }

  if ((sortCompare == cmStringSorter::Compare::STRING) &&
      (sortCaseSensitivity == cmStringSorter::CaseSensitivity::SENSITIVE) &&
      (sortOrder == cmStringSorter::Order::ASCENDING)) {
    std::sort(varArgsExpanded.begin(), varArgsExpanded.end());
  } else {
    cmStringSorter sorter(sortCompare, sortCaseSensitivity, sortOrder);
    std::sort(varArgsExpanded.begin(), varArgsExpanded.end(), sorter);
  }

  std::string value = cmJoin(varArgsExpanded, ";");
  this->Makefile->AddDefinition(listName, value.c_str());
  return true;
}